

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O1

void spvtools::opt::anon_unknown_21::AddInstructionsInBlock
               (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *instructions,BasicBlock *block)

{
  Instruction *pIVar1;
  Instruction *inst;
  Instruction *pIVar2;
  BasicBlock *__range2;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_30;
  
  pIVar1 = &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar2 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar2 != pIVar1) {
    do {
      local_30._M_head_impl = pIVar2;
      std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
      emplace_back<spvtools::opt::Instruction*>
                ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                 instructions,&local_30._M_head_impl);
      pIVar2 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar2 != pIVar1);
  }
  local_30._M_head_impl =
       (block->label_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
  emplace_back<spvtools::opt::Instruction*>
            ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
             instructions,&local_30._M_head_impl);
  return;
}

Assistant:

void AddInstructionsInBlock(std::vector<Instruction*>* instructions,
                            BasicBlock* block) {
  for (auto& inst : *block) {
    instructions->push_back(&inst);
  }

  instructions->push_back(block->GetLabelInst());
}